

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O2

void __thiscall
ON_ObjRefEvaluationParameter::ON_ObjRefEvaluationParameter(ON_ObjRefEvaluationParameter *this)

{
  long lVar1;
  
  this->m_t_type = 0;
  this->m_reserved = 0;
  lVar1 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)((long)this->m_t + lVar1 + 0x20));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x30);
  ON_COMPONENT_INDEX::ON_COMPONENT_INDEX(&this->m_t_ci);
  this->m_t[0] = -1.23432101234321e+308;
  this->m_t[1] = -1.23432101234321e+308;
  this->m_t[2] = -1.23432101234321e+308;
  this->m_t[3] = -1.23432101234321e+308;
  return;
}

Assistant:

ON_ObjRefEvaluationParameter::ON_ObjRefEvaluationParameter()
: m_t_type(0)
, m_reserved(0)
{
  m_t[0] = ON_UNSET_VALUE;
  m_t[1] = ON_UNSET_VALUE;
  m_t[2] = ON_UNSET_VALUE;
  m_t[3] = ON_UNSET_VALUE;
}